

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractnetworkcache.cpp
# Opt level: O2

void __thiscall QNetworkCacheMetaData::setUrl(QNetworkCacheMetaData *this,QUrl *url)

{
  QUrl *this_00;
  QNetworkCacheMetaDataPrivate *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QSharedDataPointer<QNetworkCacheMetaDataPrivate>::data(&this->d);
  this_00 = &pQVar1->url;
  QUrl::operator=(this_00,url);
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  QUrl::setPassword((QString *)this_00,(ParsingMode)&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  QUrl::setFragment((QString *)this_00,(ParsingMode)&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkCacheMetaData::setUrl(const QUrl &url)
{
    auto *p = d.data();
    p->url = url;
    p->url.setPassword(QString());
    p->url.setFragment(QString());
}